

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O3

QList<QNetworkCookie> * get_if<QList<QNetworkCookie>>(QVariant *v)

{
  ulong uVar1;
  PrivateShared *pPVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QMetaType local_20;
  QMetaType local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((v != (QVariant *)0x0) && (uVar1 = *(ulong *)&(v->d).field_0x18, (uVar1 & 2) == 0)) {
    local_18.d_ptr = (QMetaTypeInterface *)(uVar1 & 0xfffffffffffffffc);
    local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QNetworkCookie>_>::metaType;
    bVar3 = comparesEqual(&local_18,&local_20);
    if (bVar3) {
      if (((v->d).field_0x18 & 1) != 0) {
        pPVar2 = (v->d).data.shared;
        v = (QVariant *)(pPVar2 + *(int *)(pPVar2 + 4));
      }
      goto LAB_0019ecb8;
    }
  }
  v = (QVariant *)0x0;
LAB_0019ecb8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (QList<QNetworkCookie> *)(PrivateShared *)v;
  }
  __stack_chk_fail();
}

Assistant:

const T *get_if(const QVariant *v) noexcept
    {
        // (const) data() will not detach from is_null, return nullptr
        if (!v || v->d.is_null || v->d.type() != QMetaType::fromType<T>())
            return nullptr;
        return static_cast<const T*>(v->data());
    }